

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O2

int optimizeBlock(void)

{
  int iVar1;
  char cVar2;
  
  if (*p == '[') {
    p = p + 1;
    skipSpaces();
    if (*p == ']') {
      genByte(0x50);
LAB_0010540f:
      p = p + 1;
      skipSpaces();
      return 1;
    }
    while (iVar1 = parseStatement(), iVar1 != 0) {
      cVar2 = *p;
      if (cVar2 == '.') {
        p = p + 1;
        skipSpaces();
        cVar2 = *p;
      }
      if (cVar2 == ']') goto LAB_0010540f;
      genByte(0xf5);
    }
  }
  else {
    iVar1 = parseTerm();
    if (iVar1 != 0) {
      parseError("missing block as optimized block argument");
    }
  }
  return 0;
}

Assistant:

int optimizeBlock(void)
{
    if (*p != '[') {
        if (!parseTerm())
            return 0;
        parseError("missing block as optimized block argument");
    } else {
        p++;
        skipSpaces();
        if (*p == ']') {
            genInstruction(PushConstant, 0);
            p++;
            skipSpaces();
            return 1;
        }
        while (1) {
            if (!parseStatement())
                return 0;
            if (*p == '.')
                p++, skipSpaces();
            if (*p == ']')
                break;
            genInstruction(DoSpecial, PopTop);
        }
        p++;
        skipSpaces();
        /* just leave last expression on stack */
    }
    return 1;
}